

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidr.c++
# Opt level: O0

void __thiscall kj::CidrRange::CidrRange(CidrRange *this,StringPtr pattern)

{
  int __af;
  size_t __n;
  bool bVar1;
  uint uVar2;
  NullableValue<unsigned_long> *pNVar3;
  unsigned_long *puVar4;
  ulong size;
  char *pcVar5;
  char *__src;
  ArrayPtr<char> AVar6;
  Fault local_210;
  Fault f_2;
  int local_200;
  DebugExpression<int> local_1fc;
  undefined1 local_1f8 [8];
  DebugComparison<int,_int> _kjCondition_2;
  Fault f_1;
  uint *local_1c8;
  undefined1 local_1c0 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_1;
  Fault f;
  uint *local_188;
  undefined1 local_180 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  StringPtr local_150;
  undefined1 local_140 [8];
  ArrayPtr<char> addr;
  Array<char> addr_heap;
  char addr_stack [128];
  bool addr_isOnStack;
  size_t addr_size;
  Fault local_70 [3];
  StringPtr local_58;
  undefined1 local_48 [8];
  NullableValue<unsigned_long> _kj_result;
  size_t slashPos;
  CidrRange *this_local;
  StringPtr pattern_local;
  
  pattern_local.content.ptr = (char *)pattern.content.size_;
  this_local = (CidrRange *)pattern.content.ptr;
  StringPtr::findFirst(&local_58,(char)&this_local);
  pNVar3 = kj::_::readMaybe<unsigned_long>((Maybe<unsigned_long> *)&local_58);
  kj::_::NullableValue<unsigned_long>::NullableValue
            ((NullableValue<unsigned_long> *)local_48,pNVar3);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_58);
  puVar4 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_48);
  if (puVar4 == (unsigned_long *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
              (local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
               ,0x33,FAILED,"pattern.findFirst(\'/\') != nullptr","\"invalid CIDR\", pattern",
               (char (*) [13])"invalid CIDR",(StringPtr *)&this_local);
    kj::_::Debug::Fault::fatal(local_70);
  }
  pNVar3 = mv<kj::_::NullableValue<unsigned_long>>((NullableValue<unsigned_long> *)local_48);
  kj::_::NullableValue<unsigned_long>::NullableValue
            ((NullableValue<unsigned_long> *)&_kj_result.field_1,pNVar3);
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_48);
  puVar4 = kj::_::NullableValue<unsigned_long>::operator*
                     ((NullableValue<unsigned_long> *)&_kj_result.field_1);
  __n = *puVar4;
  kj::_::NullableValue<unsigned_long>::~NullableValue
            ((NullableValue<unsigned_long> *)&_kj_result.field_1);
  _addr_size = (ArrayPtr<const_char>)StringPtr::slice((StringPtr *)&this_local,__n + 1);
  uVar2 = StringPtr::parseAs<unsigned_int>((StringPtr *)&addr_size);
  this->bitCount = uVar2;
  size = __n + 1;
  if (size < 0x81) {
    Array<char>::Array((Array<char> *)&addr.size_,(void *)0x0);
    AVar6 = arrayPtr<char>((char *)&addr_heap.disposer,size);
  }
  else {
    heapArray<char>((Array<char> *)&addr.size_,size);
    AVar6 = kj::Array::operator_cast_to_ArrayPtr((Array *)&addr.size_);
  }
  addr.ptr = (char *)AVar6.size_;
  local_140 = (undefined1  [8])AVar6.ptr;
  pcVar5 = ArrayPtr<char>::begin((ArrayPtr<char> *)local_140);
  __src = StringPtr::begin((StringPtr *)&this_local);
  memcpy(pcVar5,__src,__n);
  pcVar5 = ArrayPtr<char>::operator[]((ArrayPtr<char> *)local_140,__n);
  *pcVar5 = '\0';
  StringPtr::findFirst(&local_150,(char)&this_local);
  bVar1 = Maybe<unsigned_long>::operator==((Maybe<unsigned_long> *)&local_150);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_150);
  if (bVar1) {
    this->family = 2;
    local_188 = (uint *)kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->bitCount);
    f.exception._4_4_ = 0x20;
    kj::_::DebugExpression<unsigned_int&>::operator<=
              ((DebugComparison<unsigned_int_&,_int> *)local_180,
               (DebugExpression<unsigned_int&> *)&local_188,(int *)((long)&f.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_180);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&,char_const(&)[13],kj::StringPtr&>
                ((Fault *)&_kjCondition_1.result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
                 ,0x3d,FAILED,"bitCount <= 32","_kjCondition,\"invalid CIDR\", pattern",
                 (DebugComparison<unsigned_int_&,_int> *)local_180,(char (*) [13])"invalid CIDR",
                 (StringPtr *)&this_local);
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_1.result);
    }
  }
  else {
    this->family = 10;
    local_1c8 = (uint *)kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->bitCount);
    f_1.exception._4_4_ = 0x80;
    kj::_::DebugExpression<unsigned_int&>::operator<=
              ((DebugComparison<unsigned_int_&,_int> *)local_1c0,
               (DebugExpression<unsigned_int&> *)&local_1c8,(int *)((long)&f_1.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1c0);
    if (!bVar1) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&,char_const(&)[13],kj::StringPtr&>
                ((Fault *)&_kjCondition_2.result,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
                 ,0x40,FAILED,"bitCount <= 128","_kjCondition,\"invalid CIDR\", pattern",
                 (DebugComparison<unsigned_int_&,_int> *)local_1c0,(char (*) [13])"invalid CIDR",
                 (StringPtr *)&this_local);
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition_2.result);
    }
  }
  __af = this->family;
  pcVar5 = ArrayPtr<char>::begin((ArrayPtr<char> *)local_140);
  local_200 = inet_pton(__af,pcVar5,this->bits);
  local_1fc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_200);
  f_2.exception._4_4_ = 0;
  kj::_::DebugExpression<int>::operator>
            ((DebugComparison<int,_int> *)local_1f8,&local_1fc,(int *)((long)&f_2.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1f8);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&,char_const(&)[13],kj::StringPtr&>
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
               ,0x43,FAILED,"inet_pton(family, addr.begin(), bits) > 0",
               "_kjCondition,\"invalid CIDR\", pattern",(DebugComparison<int,_int> *)local_1f8,
               (char (*) [13])"invalid CIDR",(StringPtr *)&this_local);
    kj::_::Debug::Fault::fatal(&local_210);
  }
  zeroIrrelevantBits(this);
  Array<char>::~Array((Array<char> *)&addr.size_);
  return;
}

Assistant:

CidrRange::CidrRange(StringPtr pattern) {
  size_t slashPos = KJ_REQUIRE_NONNULL(pattern.findFirst('/'), "invalid CIDR", pattern);

  bitCount = pattern.slice(slashPos + 1).parseAs<uint>();

  KJ_STACK_ARRAY(char, addr, slashPos + 1, 128, 128);
  memcpy(addr.begin(), pattern.begin(), slashPos);
  addr[slashPos] = '\0';

  if (pattern.findFirst(':') == kj::none) {
    family = AF_INET;
    KJ_REQUIRE(bitCount <= 32, "invalid CIDR", pattern);
  } else {
    family = AF_INET6;
    KJ_REQUIRE(bitCount <= 128, "invalid CIDR", pattern);
  }

  KJ_ASSERT(inet_pton(family, addr.begin(), bits) > 0, "invalid CIDR", pattern);
  zeroIrrelevantBits();
}